

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  int iVar1;
  pointer ppFVar2;
  bool bVar3;
  int iVar4;
  Descriptor *this;
  Reflection *this_00;
  MessageOptions *pMVar5;
  reference ppFVar6;
  UnknownFieldSet *pUVar7;
  size_t sVar8;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  int local_50;
  int i;
  undefined1 local_40 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  size_t our_size;
  Reflection *message_reflection;
  Descriptor *descriptor;
  Message *message_local;
  
  this = Message::GetDescriptor(message);
  this_00 = Message::GetReflection(message);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_40);
  pMVar5 = Descriptor::options(this);
  bVar3 = MessageOptions::map_entry(pMVar5);
  if (bVar3) {
    for (local_50 = 0; iVar1 = local_50, iVar4 = Descriptor::field_count(this), iVar1 < iVar4;
        local_50 = local_50 + 1) {
      __range2 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)Descriptor::field(this,local_50);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_40,(value_type *)&__range2);
    }
  }
  else {
    Reflection::ListFields
              (this_00,message,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_40);
  }
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_40);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_40);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                     *)&field), bVar3) {
    ppFVar6 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    sVar8 = FieldByteSize(*ppFVar6,message);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(sVar8 + (long)fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  }
  pMVar5 = Descriptor::options(this);
  bVar3 = MessageOptions::message_set_wire_format(pMVar5);
  if (bVar3) {
    pUVar7 = Reflection::GetUnknownFields(this_00,message);
    sVar8 = ComputeUnknownMessageSetItemsSize(pUVar7);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(sVar8 + (long)fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    pUVar7 = Reflection::GetUnknownFields(this_00,message);
    sVar8 = ComputeUnknownFieldsSize(pUVar7);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(sVar8 + (long)fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ppFVar2 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_40);
  return (size_t)ppFVar2;
}

Assistant:

size_t WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = 0;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (const FieldDescriptor* field : fields) {
    our_size += FieldByteSize(field, message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
        message_reflection->GetUnknownFields(message));
  } else {
    our_size +=
        ComputeUnknownFieldsSize(message_reflection->GetUnknownFields(message));
  }

  return our_size;
}